

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

void __thiscall cbor_bytes::cbor_bytes(cbor_bytes *this,cbor_bytes *other)

{
  uint8_t *puVar1;
  cbor_bytes *other_local;
  cbor_bytes *this_local;
  
  this->l = other->l;
  if (this->l == 0) {
    this->v = (uint8_t *)0x0;
  }
  else {
    puVar1 = (uint8_t *)operator_new__(this->l);
    this->v = puVar1;
    memcpy(this->v,other->v,this->l);
  }
  return;
}

Assistant:

cbor_bytes::cbor_bytes(const cbor_bytes& other)
{
    l = other.l;
    if (l > 0) {
        v = new uint8_t[l];
        memcpy(v, other.v, l);
    }
    else {
        v = NULL;
    }
}